

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O0

char gpu::deviceTypeMax<signed_char>(void)

{
  int8_t iVar1;
  Type TVar2;
  gpu_exception *this;
  undefined1 local_20 [8];
  Context context;
  
  Context::Context((Context *)local_20);
  TVar2 = Context::type((Context *)local_20);
  if (TVar2 == TypeOpenCL) {
    iVar1 = ocl::OpenCLType<signed_char>::max();
    Context::~Context((Context *)local_20);
    return iVar1;
  }
  this = (gpu_exception *)__cxa_allocate_exception(0x10);
  gpu_exception::gpu_exception(this,"No GPU active context!");
  __cxa_throw(this,&gpu_exception::typeinfo,gpu_exception::~gpu_exception);
}

Assistant:

T gpu::deviceTypeMax() {
	Context context;
#ifdef CUDA_SUPPORT
	if (context.type() == Context::TypeCUDA) {
		return std::numeric_limits<T>::max();
	} else
#endif
	if (context.type() == Context::TypeOpenCL) {
		return ocl::OpenCLType<T>::max();
	} else {
		throw gpu_exception("No GPU active context!");
	}
}